

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O1

void highsLogHeader(HighsLogOptions *log_options,bool log_githash)

{
  long *plVar1;
  size_type *psVar2;
  undefined7 in_register_00000031;
  string githash_text;
  string githash_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  githash_string._M_dataplus._M_p = (pointer)&githash_string.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&githash_string,"fd8665394","");
  if ((int)CONCAT71(in_register_00000031,log_githash) == 0) {
    githash_text._M_dataplus._M_p = (pointer)&githash_text.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&githash_text,"");
  }
  else {
    std::operator+(&local_38," (git hash: ",&githash_string);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_38);
    githash_text._M_dataplus._M_p = (pointer)&githash_text.field_2;
    psVar2 = (size_type *)(plVar1 + 2);
    if ((size_type *)*plVar1 == psVar2) {
      githash_text.field_2._M_allocated_capacity = *psVar2;
      githash_text.field_2._8_8_ = plVar1[3];
    }
    else {
      githash_text.field_2._M_allocated_capacity = *psVar2;
      githash_text._M_dataplus._M_p = (pointer)*plVar1;
    }
    githash_text._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
  }
  if ((log_githash) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2)) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  highsLogUser(log_options,kInfo,"Running HiGHS %d.%d.%d%s: %s\n",1,10,0,
               githash_text._M_dataplus._M_p,kHighsCopyrightStatement_abi_cxx11_._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)githash_text._M_dataplus._M_p != &githash_text.field_2) {
    operator_delete(githash_text._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)githash_string._M_dataplus._M_p != &githash_string.field_2) {
    operator_delete(githash_string._M_dataplus._M_p);
  }
  return;
}

Assistant:

void highsLogHeader(const HighsLogOptions& log_options,
                    const bool log_githash) {
  const std::string githash_string(HIGHS_GITHASH);
  const std::string githash_text =
      log_githash ? " (git hash: " + githash_string + ")" : "";
  highsLogUser(log_options, HighsLogType::kInfo,
               "Running HiGHS %d.%d.%d%s: %s\n", (int)HIGHS_VERSION_MAJOR,
               (int)HIGHS_VERSION_MINOR, (int)HIGHS_VERSION_PATCH,
               githash_text.c_str(), kHighsCopyrightStatement.c_str());
}